

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  sexp_conflict psVar2;
  int code;
  sexp_conflict res;
  char **in_stack_00000340;
  int in_stack_0000034c;
  
  sexp_scheme_init();
  psVar2 = run_main(in_stack_0000034c,in_stack_00000340);
  if (((ulong)psVar2 & 1) == 1) {
    auVar1._8_8_ = (long)psVar2 >> 0x3f;
    auVar1._0_8_ = (ulong)psVar2 & 0xfffffffffffffffe;
    return SUB164(auVar1 / SEXT816(2),0);
  }
  if (psVar2 == (sexp_conflict)&DAT_0000003e) {
    exit(0x46);
  }
  exit(0);
}

Assistant:

int main (int argc, char **argv) {
  sexp res;
#if SEXP_USE_PRINT_BACKTRACE_ON_SEGFAULT
  signal(SIGSEGV, sexp_segfault_handler); 
#endif
  sexp_scheme_init();
  res = run_main(argc, argv);
  if (sexp_fixnump(res)) {
    int code = sexp_unbox_fixnum(res);
#ifdef PLAN9
    if (code == 0) {
      exit_success();
    } else {
      exit_failure();
    }
#else
    return code;
#endif
  } else if (res == SEXP_FALSE) {
    exit_failure();
  } else {
    exit_success();
  }
  return 0;
}